

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

bool glcts::PipelineStatisticsQueryUtilities::isQuerySupported
               (GLenum value,ContextInfo *context_info,RenderContext *render_context)

{
  bool bVar1;
  ContextType CVar2;
  ApiType AVar3;
  bool local_21;
  bool result;
  RenderContext *render_context_local;
  ContextInfo *context_info_local;
  GLenum value_local;
  
  local_21 = true;
  if (value - 0x82f1 < 2) {
    CVar2.super_ApiType.m_bits = (ApiType)(*render_context->_vptr_RenderContext[2])();
    AVar3 = glu::ApiType::compatibility(4,0);
    bVar1 = glu::contextSupports(CVar2,AVar3);
    if (bVar1) {
      return true;
    }
    bVar1 = glu::ContextInfo::isExtensionSupported(context_info,"GL_ARB_tessellation_shader");
    if (bVar1) {
      return true;
    }
    return false;
  }
  if (value != 0x82f3) {
    if (value == 0x82f5) {
      CVar2.super_ApiType.m_bits = (ApiType)(*render_context->_vptr_RenderContext[2])();
      AVar3 = glu::ApiType::core(4,3);
      bVar1 = glu::contextSupports(CVar2,AVar3);
      if (bVar1) {
        return true;
      }
      bVar1 = glu::ContextInfo::isExtensionSupported(context_info,"GL_ARB_compute_shader");
      if (bVar1) {
        return true;
      }
      return false;
    }
    if (value != 0x887f) {
      return true;
    }
  }
  CVar2.super_ApiType.m_bits = (ApiType)(*render_context->_vptr_RenderContext[2])();
  AVar3 = glu::ApiType::core(3,2);
  bVar1 = glu::contextSupports(CVar2,AVar3);
  if ((!bVar1) &&
     (bVar1 = glu::ContextInfo::isExtensionSupported(context_info,"GL_ARB_geometry_shader4"), !bVar1
     )) {
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool PipelineStatisticsQueryUtilities::isQuerySupported(glw::GLenum value, const glu::ContextInfo& context_info,
														const glu::RenderContext& render_context)
{
	bool result = true;

	switch (value)
	{
	case GL_GEOMETRY_SHADER_INVOCATIONS:
	case GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB:
	{
		if (!glu::contextSupports(render_context.getType(), glu::ApiType::core(3, 2)) &&
			!context_info.isExtensionSupported("GL_ARB_geometry_shader4"))
		{
			result = false;
		}

		break;
	}

	case GL_TESS_CONTROL_SHADER_PATCHES_ARB:
	case GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB:
	{
		if (!glu::contextSupports(render_context.getType(), glu::ApiType::compatibility(4, 0)) &&
			!context_info.isExtensionSupported("GL_ARB_tessellation_shader"))
		{
			result = false;
		}

		break;
	}

	case GL_COMPUTE_SHADER_INVOCATIONS_ARB:
	{
		if (!glu::contextSupports(render_context.getType(), glu::ApiType::core(4, 3)) &&
			!context_info.isExtensionSupported("GL_ARB_compute_shader"))
		{
			result = false;
		}

		break;
	}
	} /* switch (value) */

	return result;
}